

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_skip_list.c
# Opt level: O2

void test_skiplist_delete_nonexist_single(planck_unit_test_t *tc)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  int fake_key;
  int key;
  ion_byte_t value [10];
  ion_skiplist_t skiplist;
  
  initialize_skiplist_std_conditions(&skiplist);
  key = 0x10;
  builtin_memcpy(value,"Delete me",10);
  iVar2 = sl_insert(&skiplist,&key,value);
  pVar1 = planck_unit_assert_true
                    (tc,(uint)(iVar2.error == '\0'),0x377,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                     ,"condition was false, expected true");
  if (pVar1 != '\0') {
    pVar1 = planck_unit_assert_true
                      (tc,(uint)(iVar2.count == 1),0x378,
                       "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                       ,"condition was false, expected true");
    if (pVar1 != '\0') {
      fake_key = 0x21;
      iVar2 = sl_delete(&skiplist,&fake_key);
      pVar1 = planck_unit_assert_true
                        (tc,(uint)(iVar2.error == '\x01'),0x382,
                         "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                         ,"condition was false, expected true");
      if (pVar1 != '\0') {
        pVar1 = planck_unit_assert_true
                          (tc,(uint)((ulong)iVar2 >> 0x20 == 0),899,
                           "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/skip_list/test_skip_list.c"
                           ,"condition was false, expected true");
        if (pVar1 != '\0') {
          sl_destroy(&skiplist);
          return;
        }
      }
    }
  }
  longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
}

Assistant:

void
test_skiplist_delete_nonexist_single(
	planck_unit_test_t *tc
) {
	PRINT_HEADER();

	ion_skiplist_t skiplist;

	initialize_skiplist_std_conditions(&skiplist);

	int			key = 16;
	ion_byte_t	value[10];

	strcpy((char *) value, "Delete me");

	ion_status_t status = sl_insert(&skiplist, (ion_key_t) &key, value);

	PLANCK_UNIT_ASSERT_TRUE(tc, err_ok == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 1 == status.count);

	int fake_key = 33;

	status = sl_delete(&skiplist, (ion_key_t) &fake_key);

#if ION_DEBUG
	print_skiplist(&skip_list);
#endif

	PLANCK_UNIT_ASSERT_TRUE(tc, err_item_not_found == status.error);
	PLANCK_UNIT_ASSERT_TRUE(tc, 0 == status.count);

	sl_destroy(&skiplist);
}